

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

Maybe<capnp::schema::Node::Reader> * __thiscall
capnp::compiler::Compiler::Node::resolveFinalSchema
          (Maybe<capnp::schema::Node::Reader> *__return_storage_ptr__,Node *this,uint64_t id)

{
  Impl *id_00;
  Fault local_40;
  Fault f;
  Node *node;
  Node *local_28;
  Node *_node959;
  uint64_t id_local;
  Node *this_local;
  
  _node959 = (Node *)id;
  id_local = (uint64_t)this;
  this_local = (Node *)__return_storage_ptr__;
  id_00 = CompiledModule::getCompiler(this->module);
  Compiler::Impl::findNode((Impl *)&node,(uint64_t)id_00);
  f.exception = (Exception *)
                kj::_::readMaybe<capnp::compiler::Compiler::Node>
                          ((Maybe<capnp::compiler::Compiler::Node_&> *)&node);
  local_28 = (Node *)f.exception;
  if ((Node *)f.exception != (Node *)0x0) {
    getFinalSchema(__return_storage_ptr__,(Node *)f.exception);
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[51]>
            (&local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/compiler.c++"
             ,0x3c2,FAILED,(char *)0x0,"\"Tried to get schema for ID we haven\'t seen before.\"",
             (char (*) [51])"Tried to get schema for ID we haven\'t seen before.");
  kj::_::Debug::Fault::fatal(&local_40);
}

Assistant:

kj::Maybe<schema::Node::Reader> Compiler::Node::resolveFinalSchema(uint64_t id) {
  KJ_IF_SOME(node, module->getCompiler().findNode(id)) {
    return node.getFinalSchema();
  } else {
    KJ_FAIL_REQUIRE("Tried to get schema for ID we haven't seen before.");
  }
}